

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyForTypeOfScoped<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  unsigned_short localRegisterID;
  ushort uVar1;
  ImplicitCallFlags flags;
  bool bVar2;
  uint16 uVar3;
  PropertyId PVar4;
  ScriptContext *pSVar5;
  ThreadContext *this_00;
  FrameDisplay *pFVar6;
  InlineCache *pIVar7;
  FunctionBody *pFVar8;
  Var pvVar9;
  Var local_98;
  Var value;
  PropertyValueInfo info;
  DynamicObject *obj;
  int length;
  ScriptContext *scriptContext;
  InlineCache *inlineCache;
  FrameDisplay *pScope;
  PropertyId propertyId;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar5 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar5);
  flags = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  PVar4 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  pFVar6 = GetEnvForEvalCode(this);
  pIVar7 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  pSVar5 = GetScriptContext(this);
  uVar3 = FrameDisplay::GetLength(pFVar6);
  if (uVar3 == 1) {
    info._56_8_ = FrameDisplay::GetItem(pFVar6,0);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    pFVar8 = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,pFVar8,pIVar7,(uint)playout->inlineCacheIndex,true);
    bVar2 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      ((Var)info._56_8_,false,(RecyclableObject *)info._56_8_,PVar4,&local_98,pSVar5
                       ,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
    if (bVar2) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      ThreadContext::AddImplicitCallFlags(this_00,flags);
      SetReg<unsigned_short>(this,playout->Value,local_98);
      return;
    }
  }
  localRegisterID = playout->Value;
  pFVar8 = GetFunctionBody(this);
  pIVar7 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  uVar1 = playout->inlineCacheIndex;
  pFVar6 = GetEnvForEvalCode(this);
  PVar4 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  pvVar9 = GetReg<unsigned_int>(this,1);
  pvVar9 = Js::JavascriptOperators::PatchGetPropertyForTypeOfScoped<false,Js::InlineCache>
                     (pFVar8,pIVar7,(uint)uVar1,pFVar6,PVar4,pvVar9);
  SetReg<unsigned_short>(this,localRegisterID,pvVar9);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyForTypeOfScoped(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Get the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        int length = pScope->GetLength();
        if (1 == length)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(0);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, scriptContext, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

                SetReg(playout->Value, value);
                return;
            }
        }

        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetPropertyForTypeOfScoped<false>(
                GetFunctionBody(),
                GetInlineCache(playout->inlineCacheIndex),
                playout->inlineCacheIndex,
                GetEnvForEvalCode(),
                GetPropertyIdFromCacheId(playout->inlineCacheIndex),
                GetReg(Js::FunctionBody::RootObjectRegSlot)));

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }